

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bumpers.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  char *pcVar5;
  int baud;
  RobotModel model;
  string port;
  Create robot;
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  char *local_1a0 [2];
  char local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [320];
  
  local_1a8 = ___cxa_end_catch;
  local_1b8 = CONCAT44(create::RobotModel::CREATE_2._4_4_,(undefined4)create::RobotModel::CREATE_2);
  uStack_1b0 = CONCAT44(uRam000000000010915c,_Init);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"/dev/ttyUSB0","");
  pcVar5 = "Running driver for Create 2";
  if (1 < argc) {
    std::__cxx11::string::string((string *)local_180,argv[1],(allocator *)&local_1bc);
    iVar2 = std::__cxx11::string::compare((char *)local_180);
    if (local_180[0] != local_170) {
      operator_delete(local_180[0]);
    }
    if (iVar2 == 0) {
      local_1a8 = ___ostream_insert<char,std::char_traits<char>>;
      local_1b8 = create::RobotModel::CREATE_1;
      uStack_1b0 = _getLightSignalFrontLeft;
      pcVar5 = "Running driver for Create 1";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  create::Create::Create((Create *)local_180,1);
  cVar1 = create::Create::connect((string *)local_180,(int *)local_1a0);
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to connect to robot on port ",0x23);
    pcVar5 = local_1a0[0];
    if (local_1a0[0] == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x109128);
    }
    else {
      sVar3 = strlen(local_1a0[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    create::Create::~Create((Create *)local_180);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    return 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Connected to robot",0x12);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_1bc = 3;
  create::Create::setMode((CreateMode *)local_180);
  do {
    cVar1 = create::RobotModel::operator==
                      ((RobotModel *)&local_1b8,(RobotModel *)&create::RobotModel::CREATE_2);
    if (cVar1 != '\0') {
      create::Create::getLightSignalLeft();
      create::Create::getLightSignalFrontLeft();
      create::Create::getLightSignalCenterLeft();
      create::Create::getLightSignalCenterRight();
      create::Create::getLightSignalFrontRight();
      create::Create::getLightSignalRight();
      create::Create::isLightBumperLeft();
      create::Create::isLightBumperFrontLeft();
      create::Create::isLightBumperCenterLeft();
      create::Create::isLightBumperCenterRight();
      create::Create::isLightBumperFrontRight();
      create::Create::isLightBumperRight();
    }
    create::Create::isLeftBumper();
    create::Create::isRightBumper();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ ",2);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ]",2);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ ",2);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ]",2);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ ",2);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ]",2);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    usleep(100000);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  uint16_t light_signals[6] = {0, 0, 0, 0, 0, 0};
  bool light_bumpers[6] = {false, false, false, false, false, false};
  bool contact_bumpers[2] = {false, false};

  while (true) {
    // Get light sensor data (only available for Create 2 or later robots)
    if (model == create::RobotModel::CREATE_2) {
      // Get raw light signal values
      light_signals[0] = robot.getLightSignalLeft();
      light_signals[1] = robot.getLightSignalFrontLeft();
      light_signals[2] = robot.getLightSignalCenterLeft();
      light_signals[3] = robot.getLightSignalCenterRight();
      light_signals[4] = robot.getLightSignalFrontRight();
      light_signals[5] = robot.getLightSignalRight();

      // Get obstacle data from light sensors (true/false)
      light_bumpers[0] = robot.isLightBumperLeft();
      light_bumpers[1] = robot.isLightBumperFrontLeft();
      light_bumpers[2] = robot.isLightBumperCenterLeft();
      light_bumpers[3] = robot.isLightBumperCenterRight();
      light_bumpers[4] = robot.isLightBumperFrontRight();
      light_bumpers[5] = robot.isLightBumperRight();
    }

    // Get state of bumpers
    contact_bumpers[0] = robot.isLeftBumper();
    contact_bumpers[1] = robot.isRightBumper();

    // Print signals from left to right
    std::cout << "[ " << light_signals[0] << " , "
                      << light_signals[1] << " , "
                      << light_signals[2] << " , "
                      << light_signals[3] << " , "
                      << light_signals[4] << " , "
                      << light_signals[5]
              << " ]" << std::endl;
    std::cout << "[ " << light_bumpers[0] << " , "
                      << light_bumpers[1] << " , "
                      << light_bumpers[2] << " , "
                      << light_bumpers[3] << " , "
                      << light_bumpers[4] << " , "
                      << light_bumpers[5]
              << " ]" << std::endl;
    std::cout << "[ " << contact_bumpers[0] << " , "
                      << contact_bumpers[1]
              << " ]" << std::endl;
    std::cout << std::endl;

    usleep(100000);  // 10 Hz
  }

  return 0;
}